

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_storage.hpp
# Opt level: O2

void __thiscall
inja::FunctionStorage::add_callback
          (FunctionStorage *this,string_view name,int num_args,CallbackFunction *callback)

{
  allocator<char> local_a1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  char local_90 [8];
  undefined8 uStack_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_80;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  FunctionData local_48;
  
  local_58._M_str = name._M_str;
  local_58._M_len = name._M_len;
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_a0,&local_58,&local_a1);
  local_80.first._M_dataplus._M_p = (pointer)&local_80.first.field_2;
  if (local_a0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90) {
    local_80.first.field_2._8_8_ = uStack_88;
  }
  else {
    local_80.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_80.first._M_string_length = local_98;
  local_98 = 0;
  local_90[0] = '\0';
  local_48.operation = Callback;
  local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_90;
  local_80.second = num_args;
  std::
  function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
  ::function(&local_48.callback,callback);
  ::std::
  _Rb_tree<std::pair<std::__cxx11::string,int>,std::pair<std::pair<std::__cxx11::string,int>const,inja::FunctionStorage::FunctionData>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,int>const,inja::FunctionStorage::FunctionData>>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,inja::FunctionStorage::FunctionData>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,int>,inja::FunctionStorage::FunctionData>
            ((_Rb_tree<std::pair<std::__cxx11::string,int>,std::pair<std::pair<std::__cxx11::string,int>const,inja::FunctionStorage::FunctionData>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,int>const,inja::FunctionStorage::FunctionData>>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,inja::FunctionStorage::FunctionData>>>
              *)&this->function_storage,&local_80,&local_48);
  std::_Function_base::~_Function_base(&local_48.callback.super__Function_base);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void add_callback(std::string_view name, int num_args, const CallbackFunction& callback) {
    function_storage.emplace(std::make_pair(static_cast<std::string>(name), num_args), FunctionData {Operation::Callback, callback});
  }